

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckCloseWithNaNFails::RunImpl(TestCheckCloseWithNaNFails *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  anon_union_4_2_76a0f8db anon_var_0;
  TestResults results;
  float local_6c;
  float local_68;
  float local_64;
  TestDetails local_60;
  TestResults local_40;
  
  local_64 = -NAN;
  UnitTest::TestResults::TestResults(&local_40,(TestReporter *)0x0);
  local_68 = 3.0;
  local_6c = 0.1;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckClose<float,float,float>(&local_40,&local_68,&local_64,&local_6c,&local_60);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68 = 1.4013e-45;
  local_6c = (float)UnitTest::TestResults::GetFailureCount(&local_40);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x82);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_68,(int *)&local_6c,&local_60);
  return;
}

Assistant:

TEST(CheckCloseWithNaNFails)
{
    union
    {
        unsigned int bitpattern;
        float nan;
    };
    bitpattern = 0xFFFFFFFF;
    TestResults results;
    CheckClose(results, 3.0f, nan, 0.1f, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}